

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O2

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::FederateInfo::makeCLIApp(FederateInfo *this)

{
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> _Var1;
  HelicsConfigJSON *pHVar2;
  App *pAVar3;
  Option *pOVar4;
  CoreType type;
  CoreType type_00;
  _func_void *in_RSI;
  _Any_data local_1178;
  code *local_1168;
  code *local_1160;
  undefined1 local_1108 [24];
  code *local_10f0;
  allocator<char> local_10e5;
  allocator<char> local_10e4;
  allocator<char> local_10e3;
  allocator<char> local_10e2;
  allocator<char> local_10e1;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_10e0;
  Validator local_10d8;
  string local_1070;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_1050;
  string local_1048;
  _func_void *local_1028;
  function<void_()> local_1020;
  function<void_(long)> local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_f80;
  string local_f78;
  string local_f58;
  string local_f38;
  string local_f18;
  string local_ef8;
  string local_ed8;
  string local_eb8;
  string local_e98;
  string local_e78;
  string local_e58;
  string local_e38;
  string local_e18;
  string local_df8;
  string local_dd8;
  string local_db8;
  string local_d98;
  string local_d78;
  string local_d58;
  string local_d38;
  string local_d18;
  string local_cf8;
  string local_cd8;
  string local_cb8;
  string local_c98;
  string local_c78;
  string local_c58;
  string local_c38;
  string local_c18;
  string local_bf8;
  string local_bd8;
  string local_bb8;
  string local_b98;
  string local_b78;
  string local_b58;
  string local_b38;
  string local_b18;
  string local_af8;
  string local_ad8;
  string local_ab8;
  string local_a98;
  string local_a78;
  string local_a58;
  string local_a38;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  string local_8f8;
  string local_8d8;
  string local_8b8;
  string local_898;
  string local_878;
  string local_858;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  filter_fn_t local_3d8;
  filter_fn_t local_3b8;
  filter_fn_t local_398;
  filter_fn_t local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  Validator local_238;
  Validator local_1d0;
  Validator local_168;
  Validator local_100;
  Validator local_98;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[22]>((char (*) [22])this);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_case_ = true;
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  pAVar3->allow_config_extras_ = ignore_all;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f8,"--config-file,--config,config",(allocator<char> *)&local_10d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"helicsConfig.ini",(allocator<char> *)local_1108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1178._M_pod_data,"specify a configuration file",
             (allocator<char> *)&local_1070);
  CLI::App::set_config(pAVar3,&local_3f8,&local_418,(string *)&local_1178,false);
  std::__cxx11::string::~string((string *)local_1178._M_pod_data);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_3f8);
  pHVar2 = addJsonConfig((App *)(this->super_CoreFederateInfo).timeProps.
                                super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
  (pHVar2->super_ConfigBase).maximumLayers = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"helics",(allocator<char> *)local_1178._M_pod_data);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pHVar2->mPromoteSection,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_438,"--name,-n",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"name of the federate",(allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_438,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0xa0),
             &local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_438);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"network type",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"",(allocator<char> *)&local_10d8);
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>(pAVar3,&local_478,&local_498)->super_App;
  pAVar3 = CLI::App::immediate_callback(pAVar3,true);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"--core",(allocator<char> *)&local_1070);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:509:13)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:509:13)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"type or name of the core to connect to",
             (allocator<char> *)&local_1048);
  pOVar4 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar3,&local_4b8,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_1178,&local_4d8);
  helics::core::to_string_abi_cxx11_
            ((string *)local_1108,(core *)(ulong)*(uint *)(in_RSI + 0x50),type);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10d8,
                 "(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1108
                );
  std::operator+(&local_278,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10d8,
                 ")");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)local_1108);
  std::__cxx11::string::~string((string *)&local_4d8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,"--force_new_core",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"if set to true will force the federate to generate a new core",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_4f8,(bool *)(in_RSI + 0x58),&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"--coretype,-t",(allocator<char> *)&local_1070);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:523:13)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:523:13)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"type  of the core to connect to",(allocator<char> *)&local_1048);
  pOVar4 = CLI::App::add_option_function<std::__cxx11::string>
                     (pAVar3,&local_538,
                      (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                       *)&local_1178,&local_558);
  helics::core::to_string_abi_cxx11_
            ((string *)local_1108,(core *)(ulong)*(uint *)(in_RSI + 0x50),type_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10d8,
                 "(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1108
                );
  std::operator+(&local_578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_10d8,
                 ")");
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_578);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"HELICS_CORE_TYPE",(allocator<char> *)&local_1050);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)local_1108);
  std::__cxx11::string::~string((string *)&local_558);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_538);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"--corename",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"the name of the core to create or find",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_598,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0xc0),
             &local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"--coreinitstring,-i",(allocator<char> *)&local_10d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"The initialization arguments for the core",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_5d8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0xe0),&local_5f8);
  local_1178._M_unused._M_object = (void *)0x0;
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:536:21)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:536:21)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"",(allocator<char> *)&local_1070);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"",(allocator<char> *)&local_1048);
  pOVar4 = CLI::Option::transform
                     (pOVar4,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1178,&local_618,&local_638);
  pOVar4 = CLI::Option::multi_option_policy(pOVar4,Join);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"HELICS_CORE_INIT_STRING",(allocator<char> *)&local_1050);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"--brokerinitstring",(allocator<char> *)&local_10d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"The initialization arguments for the broker if autogenerated",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_658,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x100),&local_678);
  local_1178._M_unused._M_object = (void *)0x0;
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:545:21)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:545:21)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"",(allocator<char> *)&local_1070);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b8,"",(allocator<char> *)&local_1048);
  pOVar4 = CLI::Option::transform
                     (pOVar4,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1178,&local_698,&local_6b8);
  CLI::Option::multi_option_policy(pOVar4,Join);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"--broker,--brokeraddress",
             (allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f8,"address or name of the broker to connect",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_6d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x120),
             &local_6f8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_6d8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"--brokerport",(allocator<char> *)&local_10d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Port number of the Broker",(allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
                     (pAVar3,&local_718,(int *)(in_RSI + 0x54),&local_738);
  CLI::Validator::Validator(&local_98,(Validator *)CLI::PositiveNumber);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1178._M_pod_data,"",(allocator<char> *)&local_1070);
  CLI::Option::check(pOVar4,&local_98,(string *)&local_1178);
  std::__cxx11::string::~string((string *)local_1178._M_pod_data);
  CLI::Validator::~Validator(&local_98);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_718);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"broker",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_778,"broker specific options",(allocator<char> *)&local_10d8);
  pAVar3 = CLI::App::add_subcommand(pAVar3,&local_758,&local_778);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_798,"--host,--name",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b8,"address or name of the broker to connect",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_798,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x120),
             &local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"--port",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f8,"port to connect to",(allocator<char> *)&local_10d8);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (pAVar3,&local_7d8,(int *)(in_RSI + 0x54),&local_7f8);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_818,"--auto",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"tell the core to automatically generate a broker if needed",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_818,(bool *)(in_RSI + 0x4d),&local_838);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"--key",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,
             "specify a key to use to match a broker should match the broker key",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_858,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x140),
             &local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_898,"--initstring",(allocator<char> *)&local_10d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8b8,"The initialization arguments for the broker if autogenerated",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_898,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x100),&local_8b8);
  local_1178._M_unused._M_object = (void *)0x0;
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:567:21)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:567:21)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d8,"",(allocator<char> *)&local_1070);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"",(allocator<char> *)&local_1048);
  pOVar4 = CLI::Option::transform
                     (pOVar4,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1178,&local_8d8,&local_8f8);
  CLI::Option::multi_option_policy(pOVar4,Join);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::__cxx11::string::~string((string *)&local_8d8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_8b8);
  std::__cxx11::string::~string((string *)&local_898);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,"--port",(allocator<char> *)local_1108);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:574:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:574:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"Specify the port number to use",(allocator<char> *)&local_1070);
  pOVar4 = CLI::App::add_option_function<int>
                     (pAVar3,&local_918,(function<void_(const_int_&)> *)&local_1178,&local_938);
  CLI::Validator::Validator(&local_100,(Validator *)CLI::PositiveNumber);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10d8,"",(allocator<char> *)&local_1048);
  CLI::Option::check(pOVar4,&local_100,(string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10d8);
  CLI::Validator::~Validator(&local_100);
  std::__cxx11::string::~string((string *)&local_938);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_918);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_958,"--localport",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_978,"Port number to use for connections to this federate",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_958,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x160),
             &local_978);
  std::__cxx11::string::~string((string *)&local_978);
  std::__cxx11::string::~string((string *)&local_958);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_998,"--autobroker",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"tell the core to automatically generate a broker if needed",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_998,(bool *)(in_RSI + 0x4d),&local_9b8);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::__cxx11::string::~string((string *)&local_998);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d8,"--debugging",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f8,"tell the core to allow user debugging in a nicer fashion",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_9d8,(bool *)(in_RSI + 0x4e),&local_9f8);
  std::__cxx11::string::~string((string *)&local_9f8);
  std::__cxx11::string::~string((string *)&local_9d8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a18,"--observer",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a38,"tell the federate/core that this federate is an observer",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_a18,(bool *)(in_RSI + 0x4f),&local_a38);
  std::__cxx11::string::~string((string *)&local_a38);
  std::__cxx11::string::~string((string *)&local_a18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a58,"--allow_remote_control,!--disable_remote_control",
             (allocator<char> *)local_1178._M_pod_data);
  local_1000.super__Function_base._M_functor._8_8_ = 0;
  local_1000._M_invoker =
       CLI::std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:598:9)>
       ::_M_invoke;
  local_1000.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:598:9)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a78,
             "enable the federate to respond to certain remote operations such as disconnect",
             (allocator<char> *)&local_10d8);
  CLI::App::add_flag_function(pAVar3,&local_a58,&local_1000,&local_a78);
  std::__cxx11::string::~string((string *)&local_a78);
  CLI::std::_Function_base::~_Function_base(&local_1000.super__Function_base);
  std::__cxx11::string::~string((string *)&local_a58);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a98,"--json",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,
             "tell the core and federate to use JSON based serialization for all messages, to ensure compatibility"
             ,(allocator<char> *)&local_10d8);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar3,&local_a98,(bool *)(in_RSI + 0x59),&local_ab8);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::__cxx11::string::~string((string *)&local_a98);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad8,"--reentrant",(allocator<char> *)local_1178._M_pod_data);
  local_1020.super__Function_base._M_functor._8_8_ = 0;
  local_1020._M_invoker =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:606:9)>
       ::_M_invoke;
  local_1020.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:606:9)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,
             "specify that the federate can be reentrant (meaning it can stop and be restarted with the same name"
             ,(allocator<char> *)&local_10d8);
  CLI::App::add_flag_callback(pAVar3,&local_ad8,&local_1020,&local_af8);
  std::__cxx11::string::~string((string *)&local_af8);
  CLI::std::_Function_base::~_Function_base(&local_1020.super__Function_base);
  std::__cxx11::string::~string((string *)&local_ad8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b18,"--profiler",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b38,
             "Enable profiling and specify a file name (NOTE: use --profiler_append=<filename> in the core init string to append to an existing file)"
             ,(allocator<char> *)&local_10d8);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_b18,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x60),&local_b38);
  pOVar4->expected_min_ = 0;
  pOVar4->expected_max_ = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"log",(allocator<char> *)local_1108);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string((string *)&local_b18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b58,"--broker_key,--brokerkey,--brokerKey",
             (allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b78,
             "specify a key to use to match a broker should match the broker key",
             (allocator<char> *)&local_10d8);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar3,&local_b58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 0x140),
             &local_b78);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string((string *)&local_b58);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b98,"--offset",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:619:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:619:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb8,"the offset of the time steps (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_b98,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_bb8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_bb8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_b98);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bd8,"--period",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:624:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:624:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bf8,"the execution cycle of the federate (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_bd8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_bf8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_bf8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_bd8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c18,"--stoptime",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:629:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:629:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c38,"the maximum simulation time of a federate (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_c18,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_c38);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_c38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_c18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c58,"--timedelta",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:634:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:634:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c78,
             "The minimum time between time grants for a Federate (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_c58,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_c78);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_c78);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_c58);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c98,"encryption",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb8,"options related to encryption",(allocator<char> *)&local_10d8);
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>(pAVar3,&local_c98,&local_cb8)->super_App;
  std::__cxx11::string::~string((string *)&local_cb8);
  std::__cxx11::string::~string((string *)&local_c98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"--encrypted",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cf8,"enable encryption on the network",(allocator<char> *)&local_10d8)
  ;
  pOVar4 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                     (pAVar3,&local_cd8,(bool *)(in_RSI + 0x5a),&local_cf8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"HELICS_ENCRYPTION",(allocator<char> *)local_1108);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_cf8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d18,"--encryption_config",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d38,"set the configuration file for encryption options",
             (allocator<char> *)&local_10d8);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar3,&local_d18,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x80),&local_d38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"HELICS_ENCRYPTION_CONFIG",(allocator<char> *)local_1108);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_d38);
  std::__cxx11::string::~string((string *)&local_d18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d58,"realtime",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d78,"",(allocator<char> *)&local_10d8);
  pAVar3 = &CLI::App::add_option_group<CLI::Option_group>(pAVar3,&local_d58,&local_d78)->super_App;
  std::__cxx11::string::~string((string *)&local_d78);
  std::__cxx11::string::~string((string *)&local_d58);
  (pAVar3->option_defaults_).super_OptionBase<CLI::OptionDefaults>.ignore_underscore_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d98,"--rtlag",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:651:13)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:651:13)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_db8,
             "the amount of the time the federate is allowed to lag realtime before corrective action is taken (default in ms)"
             ,(allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_d98,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_db8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_db8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_d98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dd8,"--rtlead",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:658:13)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:658:13)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_df8,
             "the amount of the time the federate is allowed to lead realtime before corrective action is taken (default in ms)"
             ,(allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_dd8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_df8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_df8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_dd8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e18,"--rttolerance",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:665:13)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:665:13)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e38,"the time tolerance of the real time mode (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_e18,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_e38);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_e38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_e18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e58,"--inputdelay",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:671:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:671:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e78,
             "the INPUT delay on incoming communication of the federate (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_e58,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_e78);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_e78);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_e58);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e98,"--outputdelay",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:676:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:676:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,
             "the output delay for outgoing communication of the federate (default in ms)",
             (allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_e98,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_eb8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_eb8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_e98);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ed8,"--grant_timeout",(allocator<char> *)&local_10d8);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:681:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_TimeRepresentation<count_time<9,_long>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:681:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ef8,
             "timeout to trigger diagnostic action when a federate time grant is not available within the timeout period (default in ms)"
             ,(allocator<char> *)local_1108);
  pOVar4 = CLI::App::add_option_function<TimeRepresentation<count_time<9,long>>>
                     (pAVar3,&local_ed8,
                      (function<void_(const_TimeRepresentation<count_time<9,_long>_>_&)> *)
                      &local_1178,&local_ef8);
  (pOVar4->super_OptionBase<CLI::Option>).configurable_ = false;
  std::__cxx11::string::~string((string *)&local_ef8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_ed8);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f18,"--maxiterations",(allocator<char> *)local_1108);
  local_1178._8_8_ = 0;
  local_1160 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:686:12)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:686:12)>
               ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f38,"the maximum number of iterations a federate is allowed to take",
             (allocator<char> *)&local_1070);
  pOVar4 = CLI::App::add_option_function<int>
                     (pAVar3,&local_f18,(function<void_(const_int_&)> *)&local_1178,&local_f38);
  CLI::Validator::Validator(&local_168,(Validator *)CLI::PositiveNumber);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10d8,"",(allocator<char> *)&local_1048);
  CLI::Option::check(pOVar4,&local_168,(string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10d8);
  CLI::Validator::~Validator(&local_168);
  std::__cxx11::string::~string((string *)&local_f38);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_f18);
  pAVar3 = (App *)(this->super_CoreFederateInfo).timeProps.
                  super__Vector_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"--loglevel",&local_10e1);
  local_1108._8_8_ = 0;
  local_10f0 = CLI::std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:691:12)>
               ::_M_invoke;
  local_1108._16_8_ =
       CLI::std::
       _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:691:12)>
       ::_M_manager;
  local_10e0._M_head_impl = (helicsCLI11App *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f78,"the logging level of a federate",&local_10e2);
  local_1028 = in_RSI;
  pOVar4 = CLI::App::add_option_function<int>
                     (pAVar3,&local_f58,(function<void_(const_int_&)> *)local_1108,&local_f78);
  local_378.super__Function_base._M_functor._8_8_ = 0;
  local_1050 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)log_level_map_abi_cxx11_;
  local_378.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_378._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_378.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_398.super__Function_base._M_functor._8_8_ = 0;
  local_398.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_398._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_398.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::CheckedTransformer::
  CheckedTransformer<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((CheckedTransformer *)&local_1178,&local_1050,&local_378,&local_398);
  CLI::Validator::Validator(&local_1d0,(Validator *)&local_1178);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"",&local_10e3);
  pOVar4 = CLI::Option::transform(pOVar4,&local_1d0,&local_1070);
  local_3b8.super__Function_base._M_functor._8_8_ = 0;
  local_f80 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)log_level_map_abi_cxx11_;
  local_3b8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_case;
  local_3b8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_3d8.super__Function_base._M_functor._8_8_ = 0;
  local_3b8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  local_3d8.super__Function_base._M_functor._M_unused._M_object = CLI::ignore_underscore;
  local_3d8._M_invoker =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_invoke;
  local_3d8.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
       ::_M_manager;
  CLI::IsMember::
  IsMember<std::unordered_map<std::__cxx11::string,int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const*>
            ((IsMember *)&local_10d8,&local_f80,&local_3b8,&local_3d8);
  CLI::Validator::Validator(&local_238,&local_10d8);
  _Var1._M_head_impl = local_10e0._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,"",&local_10e4);
  pOVar4 = CLI::Option::transform(pOVar4,&local_238,&local_1048);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"HELICS_LOG_LEVEL",&local_10e5);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_338);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_1048);
  CLI::Validator::~Validator(&local_238);
  CLI::Validator::~Validator(&local_10d8);
  CLI::std::_Function_base::~_Function_base(&local_3d8.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_3b8.super__Function_base);
  std::__cxx11::string::~string((string *)&local_1070);
  CLI::Validator::~Validator(&local_1d0);
  CLI::Validator::~Validator((Validator *)&local_1178);
  CLI::std::_Function_base::~_Function_base(&local_398.super__Function_base);
  CLI::std::_Function_base::~_Function_base(&local_378.super__Function_base);
  std::__cxx11::string::~string((string *)&local_f78);
  CLI::std::_Function_base::~_Function_base((_Function_base *)local_1108);
  std::__cxx11::string::~string((string *)&local_f58);
  pAVar3 = (App *)((_Var1._M_head_impl)->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa0,"--separator",(allocator<char> *)local_1178._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc0,"separator character for local federates",
             (allocator<char> *)&local_10d8);
  pOVar4 = CLI::App::add_option<char,_char,_(CLI::detail::enabler)0>
                     (pAVar3,&local_fa0,(char *)(local_1028 + 0x4c),&local_fc0);
  local_358.field_2._M_local_buf[0] = (char)local_1028[0x4c];
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 1;
  local_358.field_2._M_local_buf[1] = '\0';
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->default_str_,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::__cxx11::string::~string((string *)&local_fa0);
  pAVar3 = (App *)((_Var1._M_head_impl)->super_App)._vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fe0,"--flags,-f,--flag",(allocator<char> *)&local_10d8);
  pOVar4 = CLI::App::add_option<const_char[28],_(CLI::detail::enabler)0>
                     (pAVar3,&local_fe0,(char (*) [28])"named flag for the federate");
  pOVar4->type_size_max_ = 1;
  pOVar4->type_size_min_ = 1;
  pOVar4->expected_max_ = 0x20000000;
  (pOVar4->super_OptionBase<CLI::Option>).delimiter_ = ',';
  local_1178._8_8_ = 0;
  local_1178._M_unused._M_function_pointer = local_1028;
  local_1160 = CLI::std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:704:16)>
               ::_M_invoke;
  local_1168 = CLI::std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/FederateInfo.cpp:704:16)>
               ::_M_manager;
  CLI::Option::each(pOVar4,(function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_1178);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_1178);
  std::__cxx11::string::~string((string *)&local_fe0);
  *(undefined1 *)(((_Var1._M_head_impl)->super_App)._vptr_App + 9) = 1;
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> FederateInfo::makeCLIApp()
{
    /*
    The parser for the command line options ignores underscores and cases so
    there's no need to explicitly support all three case styles. If users type
    in any of the normal HELICS variants (nocase, camelCase, and snake_case) it
    will work.
    */
    auto app = std::make_unique<helicsCLI11App>("Federate Info Parsing");
    app->option_defaults()->ignore_case()->ignore_underscore();
    app->allow_config_extras(CLI::config_extras_mode::ignore_all);
    app->set_config("--config-file,--config,config",
                    "helicsConfig.ini",
                    "specify a configuration file");

    auto* fmtr = addJsonConfig(app.get());
    fmtr->maxLayers(0);
    fmtr->promoteSection("helics");
    app->add_option("--name,-n", defName, "name of the federate");
    auto* networking = app->add_option_group("network type")->immediate_callback();
    networking
        ->add_option_function<std::string>(
            "--core",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    coreName = val;
                }
            },
            "type or name of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")");
    networking->add_flag("--force_new_core",
                         forceNewCore,
                         "if set to true will force the federate to generate a new core");
    networking
        ->add_option_function<std::string>(
            "--coretype,-t",
            [this](const std::string& val) {
                coreType = coreTypeFromString(val);
                if (coreType == CoreType::UNRECOGNIZED) {
                    throw CLI::ValidationError(val + " is NOT a recognized core type");
                }
            },
            "type  of the core to connect to")
        ->default_str("(" + to_string(coreType) + ")")
        ->envname("HELICS_CORE_TYPE");
    app->add_option("--corename", coreName, "the name of the core to create or find");
    app->add_option("--coreinitstring,-i",
                    coreInitString,
                    "The initialization arguments for the core")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join)
        ->envname("HELICS_CORE_INIT_STRING");
    app->add_option("--brokerinitstring",
                    brokerInitString,
                    "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option("--broker,--brokeraddress", broker, "address or name of the broker to connect");
    app->add_option("--brokerport", brokerPort, "Port number of the Broker")
        ->check(CLI::PositiveNumber);

    auto* brokersub = app->add_subcommand("broker", "broker specific options");
    brokersub->add_option("--host,--name", broker, "address or name of the broker to connect");
    brokersub->add_option("--port", brokerPort, "port to connect to");
    brokersub->add_flag("--auto",
                        autobroker,
                        "tell the core to automatically generate a broker if needed");
    brokersub->add_option("--key",
                          key,
                          "specify a key to use to match a broker should match the broker key");
    brokersub
        ->add_option("--initstring",
                     brokerInitString,
                     "The initialization arguments for the broker if autogenerated")
        ->transform([](std::string arg) {
            arg.insert(arg.begin(), ' ');
            return arg;
        })
        ->multi_option_policy(CLI::MultiOptionPolicy::Join);
    app->add_option_function<int>(
           "--port",
           [this](int port) {
               if (brokerPort > 0) {
                   localport = std::to_string(port);
               } else {
                   brokerPort = port;
               }
           },
           "Specify the port number to use")
        ->check(CLI::PositiveNumber);
    app->add_option("--localport",
                    localport,
                    "Port number to use for connections to this federate");
    app->add_flag("--autobroker",
                  autobroker,
                  "tell the core to automatically generate a broker if needed");
    app->add_flag("--debugging",
                  debugging,
                  "tell the core to allow user debugging in a nicer fashion");
    app->add_flag("--observer",
                  observer,
                  "tell the federate/core that this federate is an observer");
    // this is added here to match the command arguments for a broker, also works as a flag
    app->add_flag_function(
        "--allow_remote_control,!--disable_remote_control",
        [this](int64_t val) { setFlagOption(HELICS_FLAG_ALLOW_REMOTE_CONTROL, (val > 0)); },
        "enable the federate to respond to certain remote operations such as disconnect");
    app->add_flag(
        "--json",
        useJsonSerialization,
        "tell the core and federate to use JSON based serialization for all messages, to ensure compatibility");
    app->add_flag_callback(
        "--reentrant",
        [this]() { setFlagOption(HELICS_FLAG_REENTRANT, true); },
        "specify that the federate can be reentrant (meaning it can stop and be restarted with the same name");
    app->add_option(
           "--profiler",
           profilerFileName,
           "Enable profiling and specify a file name (NOTE: use --profiler_append=<filename> in the core init string to append to an existing file)")
        ->expected(0, 1)
        ->default_str("log");
    app->add_option("--broker_key,--brokerkey,--brokerKey",
                    key,
                    "specify a key to use to match a broker should match the broker key");
    app->add_option_function<Time>(
           "--offset",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OFFSET, val); },
           "the offset of the time steps (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--period",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_PERIOD, val); },
           "the execution cycle of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--stoptime",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_STOPTIME, val); },
           "the maximum simulation time of a federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--timedelta",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_DELTA, val); },
           "The minimum time between time grants for a Federate (default in ms)")
        ->configurable(false);
    auto* encrypt_group = app->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    auto* rtgroup = app->add_option_group("realtime");
    rtgroup->option_defaults()->ignore_underscore();
    rtgroup
        ->add_option_function<Time>(
            "--rtlag",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LAG, val); },
            "the amount of the time the federate is allowed to lag realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rtlead",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_LEAD, val); },
            "the amount of the time the federate is allowed to lead realtime before "
            "corrective action is taken (default in ms)")
        ->configurable(false);
    rtgroup
        ->add_option_function<Time>(
            "--rttolerance",
            [this](Time val) { setProperty(HELICS_PROPERTY_TIME_RT_TOLERANCE, val); },
            "the time tolerance of the real time mode (default in ms)")
        ->configurable(false);

    app->add_option_function<Time>(
           "--inputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_INPUT_DELAY, val); },
           "the INPUT delay on incoming communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--outputdelay",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, val); },
           "the output delay for outgoing communication of the federate (default in ms)")
        ->configurable(false);
    app->add_option_function<Time>(
           "--grant_timeout",
           [this](Time val) { setProperty(HELICS_PROPERTY_TIME_GRANT_TIMEOUT, val); },
           "timeout to trigger diagnostic action when a federate time grant is not available within the timeout period (default in ms)")
        ->configurable(false);
    app->add_option_function<int>(
           "--maxiterations",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_MAX_ITERATIONS, val); },
           "the maximum number of iterations a federate is allowed to take")
        ->check(CLI::PositiveNumber);
    app->add_option_function<int>(
           "--loglevel",
           [this](int val) { setProperty(HELICS_PROPERTY_INT_LOG_LEVEL, val); },
           "the logging level of a federate")
        ->transform(
            CLI::CheckedTransformer(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))

        ->transform(CLI::IsMember(&log_level_map, CLI::ignore_case, CLI::ignore_underscore))
        ->envname("HELICS_LOG_LEVEL");

    app->add_option("--separator", separator, "separator character for local federates")
        ->default_str(std::string(1, separator));
    app->add_option("--flags,-f,--flag", "named flag for the federate")
        ->type_size(-1)
        ->delimiter(',')
        ->each([this](const std::string& flag) { loadFlags(*this, flag); });
    app->allow_extras();
#ifdef HELICS_DISABLE_ASIO
    rtgroup->disabled();
#endif
    return app;
}